

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall ipx::Model::LoadDual(Model *this)

{
  SparseMatrix *this_00;
  pointer piVar1;
  pointer pdVar2;
  size_t sVar3;
  pointer pcVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  double dVar14;
  undefined1 local_b0 [16];
  pointer piStack_a0;
  pointer local_98;
  undefined1 local_90 [16];
  pointer local_80;
  undefined1 local_78 [16];
  pointer local_68;
  undefined1 local_60 [16];
  pointer local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  this->num_rows_ = this->num_var_;
  this->num_cols_ =
       (int)((ulong)((long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) + this->num_constr_;
  this->dualized_ = true;
  Transpose((SparseMatrix *)local_b0,&this->A_);
  (this->AI_).nrow_ = local_b0._0_4_;
  piVar1 = (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b0._8_8_;
  (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piStack_a0;
  (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_98;
  stack0xffffffffffffff58 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_90._0_8_;
  (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_90._8_8_;
  (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_80;
  local_90 = (undefined1  [16])0x0;
  local_80 = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pdVar2 = (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
  (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
  (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_68;
  local_78 = (undefined1  [16])0x0;
  local_68 = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar1 = (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_60._0_8_;
  (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_60._8_8_;
  (this->AI_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_50;
  local_60 = (undefined1  [16])0x0;
  local_50 = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pdVar2 = (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  (this->AI_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  if ((pointer)local_60._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_60._0_8_);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((pointer)local_90._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._0_8_);
  }
  if ((pointer)local_b0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._8_8_);
  }
  this_00 = &this->AI_;
  iVar8 = this->num_var_;
  if (0 < iVar8) {
    lVar12 = 0;
    do {
      if ((ulong)ABS((this->scaled_ubuser_)._M_data[lVar12]) < 0x7ff0000000000000) {
        SparseMatrix::push_back(this_00,(Int)lVar12,-1.0);
        SparseMatrix::add_column(this_00);
        iVar8 = this->num_var_;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar8);
  }
  if (0 < this->num_rows_) {
    iVar8 = 0;
    do {
      SparseMatrix::push_back(this_00,iVar8,1.0);
      SparseMatrix::add_column(this_00);
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->num_rows_);
  }
  sVar3 = (this->b_)._M_size;
  sVar13 = (this->scaled_obj_)._M_size;
  if (sVar3 == sVar13) {
    if (sVar3 == 0) goto LAB_003a806c;
    pdVar5 = (this->b_)._M_data;
    pdVar7 = (this->scaled_obj_)._M_data;
  }
  else {
    pdVar5 = (this->b_)._M_data;
    if (pdVar5 != (double *)0x0) {
      operator_delete(pdVar5);
      sVar13 = (this->scaled_obj_)._M_size;
    }
    (this->b_)._M_size = sVar13;
    pdVar5 = (double *)operator_new(sVar13 << 3);
    (this->b_)._M_data = pdVar5;
    pdVar7 = (this->scaled_obj_)._M_data;
    if (pdVar7 == (double *)0x0) goto LAB_003a806c;
    sVar3 = (this->b_)._M_size;
  }
  memcpy(pdVar5,pdVar7,sVar3 << 3);
LAB_003a806c:
  sVar13 = (long)this->num_rows_ + (long)this->num_cols_;
  pdVar5 = (this->c_)._M_data;
  if ((this->c_)._M_size != sVar13) {
    operator_delete(pdVar5);
    (this->c_)._M_size = sVar13;
    pdVar5 = (double *)operator_new(sVar13 * 8);
    (this->c_)._M_data = pdVar5;
  }
  if ((int)sVar13 != 0) {
    memset(pdVar5,0,sVar13 * 8);
  }
  sVar13 = (this->scaled_rhs_)._M_size;
  pdVar6 = (this->scaled_rhs_)._M_data;
  pdVar7 = pdVar6 + sVar13;
  if (sVar13 == 0) {
    pdVar7 = (double *)0x0;
    pdVar6 = (double *)0x0;
  }
  iVar8 = 0;
  for (; pdVar6 != pdVar7; pdVar6 = pdVar6 + 1) {
    *pdVar5 = -*pdVar6;
    pdVar5 = pdVar5 + 1;
    iVar8 = iVar8 + 1;
  }
  sVar13 = (this->scaled_ubuser_)._M_size;
  pdVar7 = (this->scaled_ubuser_)._M_data;
  pdVar5 = pdVar7 + sVar13;
  if (sVar13 == 0) {
    pdVar5 = (double *)0x0;
    pdVar7 = (double *)0x0;
  }
  if (pdVar7 != pdVar5) {
    pdVar6 = (this->c_)._M_data;
    do {
      if ((ulong)ABS(*pdVar7) < 0x7ff0000000000000) {
        lVar12 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pdVar6[lVar12] = *pdVar7;
      }
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar5);
  }
  sVar13 = (this->scaled_lbuser_)._M_size;
  pdVar7 = (this->scaled_lbuser_)._M_data;
  pdVar5 = pdVar7 + sVar13;
  if (sVar13 == 0) {
    pdVar5 = (double *)0x0;
    pdVar7 = (double *)0x0;
  }
  if (pdVar7 != pdVar5) {
    pdVar6 = (this->c_)._M_data + iVar8;
    do {
      if ((ulong)ABS(*pdVar7) < 0x7ff0000000000000) {
        dVar14 = -*pdVar7;
      }
      else {
        dVar14 = 0.0;
      }
      *pdVar6 = dVar14;
      pdVar7 = pdVar7 + 1;
      pdVar6 = pdVar6 + 1;
    } while (pdVar7 != pdVar5);
  }
  sVar13 = (long)this->num_rows_ + (long)this->num_cols_;
  pdVar5 = (this->lb_)._M_data;
  if ((this->lb_)._M_size != sVar13) {
    operator_delete(pdVar5);
    (this->lb_)._M_size = sVar13;
    pdVar5 = (double *)operator_new(sVar13 * 8);
    (this->lb_)._M_data = pdVar5;
  }
  if ((int)sVar13 != 0) {
    memset(pdVar5,0,sVar13 * 8);
  }
  sVar13 = (long)this->num_rows_ + (long)this->num_cols_;
  pdVar5 = (this->ub_)._M_data;
  if ((this->ub_)._M_size != sVar13) {
    operator_delete(pdVar5);
    (this->ub_)._M_size = sVar13;
    pdVar5 = (double *)operator_new(sVar13 * 8);
    (this->ub_)._M_data = pdVar5;
  }
  if ((int)sVar13 != 0) {
    memset(pdVar5,0,sVar13 * 8);
  }
  iVar8 = this->num_constr_;
  lVar12 = (long)iVar8;
  if (0 < lVar12) {
    pcVar4 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->lb_)._M_data;
    pdVar7 = (this->ub_)._M_data;
    lVar9 = 0;
    do {
      bVar10 = pcVar4[lVar9] - 0x3c;
      if (bVar10 < 3) {
        lVar11 = (ulong)bVar10 * 8;
        dVar14 = *(double *)(&DAT_003dc948 + lVar11);
        pdVar5[lVar9] = *(double *)(&DAT_003dc930 + lVar11);
        pdVar7[lVar9] = dVar14;
      }
      lVar9 = lVar9 + 1;
    } while (lVar12 != lVar9);
  }
  lVar9 = (long)this->num_cols_;
  if (iVar8 < this->num_cols_) {
    pdVar5 = (this->lb_)._M_data;
    pdVar7 = (this->ub_)._M_data;
    do {
      pdVar5[lVar12] = 0.0;
      pdVar7[lVar12] = INFINITY;
      lVar12 = lVar12 + 1;
    } while (lVar9 != lVar12);
  }
  iVar8 = this->num_var_;
  if (0 < (long)iVar8) {
    pdVar5 = (this->scaled_lbuser_)._M_data;
    pdVar7 = (this->lb_)._M_data;
    pdVar6 = (this->ub_)._M_data;
    lVar12 = 0;
    do {
      pdVar7[lVar9 + lVar12] = 0.0;
      dVar14 = INFINITY;
      if (0x7fefffffffffffff < (ulong)ABS(pdVar5[lVar12])) {
        dVar14 = 0.0;
      }
      pdVar6[lVar9 + lVar12] = dVar14;
      lVar12 = lVar12 + 1;
    } while (iVar8 != lVar12);
  }
  return;
}

Assistant:

void Model::LoadDual() {
    num_rows_ = num_var_;
    num_cols_ = num_constr_ + boxed_vars_.size();
    dualized_ = true;

    // Check that every variable with finite scaled_ubuser_ has finite
    // scaled_lbuser_ (must be the case after scaling).
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j]))
            assert(std::isfinite(scaled_lbuser_[j]));
    }

    // Build AI.
    AI_ = Transpose(A_);
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j])) {
            AI_.push_back(j, -1.0);
            AI_.add_column();
        }
    }
    assert(AI_.cols() == num_cols_);
    for (Int i = 0; i < num_rows_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }

    // Build vectors.
    b_ = scaled_obj_;
    c_.resize(num_cols_+num_rows_);
    Int put = 0;
    for (double x : scaled_rhs_)
        c_[put++] = -x;
    for (double x : scaled_ubuser_)
        if (std::isfinite(x))
            c_[put++] = x;
    assert(put == num_cols_);
    for (double x : scaled_lbuser_)
        // If x is negative infinity, then the variable will be fixed and we can
        // give it any (finite) cost.
        c_[put++] = std::isfinite(x) ? -x : 0.0;
    lb_.resize(num_cols_+num_rows_);
    ub_.resize(num_cols_+num_rows_);
    for (Int i = 0; i < num_constr_; i++)
        switch(constr_type_[i]) {
        case '=':
            lb_[i] = -INFINITY;
            ub_[i] = INFINITY;
            break;
        case '<':
            lb_[i] = -INFINITY;
            ub_[i] = 0.0;
            break;
        case '>':
            lb_[i] = 0.0;
            ub_[i] = INFINITY;
            break;
        }
    for (Int j = num_constr_; j < num_cols_; j++) {
        lb_[j] = 0.0;
        ub_[j] = INFINITY;
    }
    for (Int j = 0; j < num_var_; j++) {
        lb_[num_cols_+j] = 0.0;
        ub_[num_cols_+j] = std::isfinite(scaled_lbuser_[j]) ? INFINITY : 0.0;
    }
}